

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O0

CURLcode ftp_dophase_done(connectdata *conn,_Bool connected)

{
  int local_34;
  CURLcode result;
  int completed;
  ftp_conn *ftpc;
  FTP *ftp;
  connectdata *pcStack_18;
  _Bool connected_local;
  connectdata *conn_local;
  
  ftpc = (ftp_conn *)(conn->data->req).protop;
  _result = &conn->proto;
  ftp._7_1_ = connected;
  pcStack_18 = conn;
  if ((connected) && (conn_local._4_4_ = ftp_do_more(conn,&local_34), conn_local._4_4_ != CURLE_OK))
  {
    close_secondarysocket(pcStack_18);
  }
  else {
    if (*(int *)&(ftpc->pp).pending_resp == 0) {
      if ((ftp._7_1_ & 1) == 0) {
        *(uint *)&(pcStack_18->bits).field_0x4 =
             *(uint *)&(pcStack_18->bits).field_0x4 & 0xfffff7ff | 0x800;
      }
    }
    else {
      Curl_setup_transfer(pcStack_18->data,-1,-1,false,-1);
    }
    (_result->ftpc).ctl_valid = true;
    conn_local._4_4_ = CURLE_OK;
  }
  return conn_local._4_4_;
}

Assistant:

static CURLcode ftp_dophase_done(struct connectdata *conn,
                                 bool connected)
{
  struct FTP *ftp = conn->data->req.protop;
  struct ftp_conn *ftpc = &conn->proto.ftpc;

  if(connected) {
    int completed;
    CURLcode result = ftp_do_more(conn, &completed);

    if(result) {
      close_secondarysocket(conn);
      return result;
    }
  }

  if(ftp->transfer != FTPTRANSFER_BODY)
    /* no data to transfer */
    Curl_setup_transfer(conn->data, -1, -1, FALSE, -1);
  else if(!connected)
    /* since we didn't connect now, we want do_more to get called */
    conn->bits.do_more = TRUE;

  ftpc->ctl_valid = TRUE; /* seems good */

  return CURLE_OK;
}